

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

TempBufferPoolReservation * __thiscall
duckdb::StandardBufferManager::EvictBlocksOrThrow<char_const*,std::__cxx11::string>
          (TempBufferPoolReservation *__return_storage_ptr__,StandardBufferManager *this,
          MemoryTag tag,idx_t memory_delta,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *buffer,
          char *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  BufferPool *pBVar1;
  pointer pcVar2;
  StringUtil *pSVar3;
  OutOfMemoryException *this_00;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  string extra_text;
  EvictionResult r;
  allocator local_129;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  string local_68;
  char local_48 [8];
  BufferPoolReservation local_40;
  
  pBVar1 = this->buffer_pool;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pBVar1->maximum_memory).super___atomic_base<unsigned_long>._M_i;
  (*pBVar1->_vptr_BufferPool[3])
            (local_48,pBVar1,CONCAT71(in_register_00000011,tag),memory_delta,params_1,buffer);
  if (local_48[0] != '\0') {
    BufferPoolReservation::BufferPoolReservation
              (&__return_storage_ptr__->super_BufferPoolReservation,&local_40);
    TempBufferPoolReservation::~TempBufferPoolReservation((TempBufferPoolReservation *)&local_40);
    return __return_storage_ptr__;
  }
  local_128[0] = local_118;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128," (%s/%s used)","");
  pSVar3 = (StringUtil *)BufferPool::GetUsedMemory(this->buffer_pool,true);
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_68,pSVar3,0x400,memory_delta);
  pSVar3 = (StringUtil *)BufferPool::GetMaxMemory(this->buffer_pool);
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_88,pSVar3,0x400,memory_delta);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_108,(StringUtil *)local_128,&local_68,&local_88,params_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0]);
  }
  ::std::__cxx11::string::append((char *)&local_108);
  this_00 = (OutOfMemoryException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_a8,args,&local_129);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar2 = (args_1->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + args_1->_M_string_length);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_108._M_dataplus._M_p,
             local_108._M_dataplus._M_p + local_108._M_string_length);
  OutOfMemoryException::OutOfMemoryException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_a8,&local_c8,&local_e8);
  __cxa_throw(this_00,&OutOfMemoryException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TempBufferPoolReservation StandardBufferManager::EvictBlocksOrThrow(MemoryTag tag, idx_t memory_delta,
                                                                    unique_ptr<FileBuffer> *buffer, ARGS... args) {
	auto r = buffer_pool.EvictBlocks(tag, memory_delta, buffer_pool.maximum_memory, buffer);
	if (!r.success) {
		string extra_text = StringUtil::Format(" (%s/%s used)", StringUtil::BytesToHumanReadableString(GetUsedMemory()),
		                                       StringUtil::BytesToHumanReadableString(GetMaxMemory()));
		extra_text += InMemoryWarning();
		throw OutOfMemoryException(args..., extra_text);
	}
	return std::move(r.reservation);
}